

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

void ttdell(int row,int bot,int nchunk)

{
  int iVar1;
  undefined8 uVar2;
  int local_18;
  int nl;
  int i;
  int nchunk_local;
  int bot_local;
  int row_local;
  
  if (row == bot) {
    ttmove(row,0);
    tteeol();
  }
  else if (*(long *)(*(long *)(_cur_term + 0x20) + 0x18) == 0) {
    if (insdel == 0) {
      panic("ttdell: Can\'t insert/delete line");
    }
    ttmove(row,0);
    iVar1 = nrow - ttrow;
    if (*(long *)(*(long *)(_cur_term + 0x20) + 0x350) == 0) {
      for (local_18 = 0; local_18 < nchunk; local_18 = local_18 + 1) {
        tputs(*(undefined8 *)(*(long *)(_cur_term + 0x20) + 0xb0),iVar1,ttputc);
      }
    }
    else {
      uVar2 = tgoto(*(undefined8 *)(*(long *)(_cur_term + 0x20) + 0x350),0,nchunk);
      tputs(uVar2,iVar1,ttputc);
    }
    ttmove((bot + 1) - nchunk,0);
    iVar1 = nrow - ttrow;
    if (*(long *)(*(long *)(_cur_term + 0x20) + 0x370) == 0) {
      for (local_18 = 0; local_18 < nchunk; local_18 = local_18 + 1) {
        tputs(*(undefined8 *)(*(long *)(_cur_term + 0x20) + 0x1a8),iVar1,ttputc);
      }
    }
    else {
      uVar2 = tgoto(*(undefined8 *)(*(long *)(_cur_term + 0x20) + 0x370),0,nchunk);
      tputs(uVar2,iVar1,ttputc);
    }
    ttrow = 1000;
    ttcol = 1000;
  }
  else {
    ttwindow(row,bot);
    ttmove(bot,0);
    nl = nchunk;
    while (nl != 0) {
      tputs(scroll_fwd,bot - row,ttputc);
      nl = nl + -1;
    }
    ttnowindow();
  }
  return;
}

Assistant:

void
ttdell(int row, int bot, int nchunk)
{
	int	i, nl;

	/* One line special cases */
	if (row == bot) {
		ttmove(row, 0);
		tteeol();
		return;
	}
	/* scrolling region */
	if (change_scroll_region) {
		nl = bot - row;
		ttwindow(row, bot);
		ttmove(bot, 0);
		while (nchunk--)
			putpad(scroll_fwd, nl);
		ttnowindow();
	/* else use insert/delete line */
	} else if (insdel) {
		ttmove(row, 0);
		nl = nrow - ttrow;
		if (parm_delete_line)
			putpad(tgoto(parm_delete_line, 0, nchunk), nl);
		else
			/* For all lines in the chunk */
			for (i = 0; i < nchunk; i++)
				putpad(delete_line, nl);
		ttmove(1 + bot - nchunk, 0);

		/* ttmove() changes ttrow */
		nl = nrow - ttrow;

		if (parm_insert_line)
			putpad(tgoto(parm_insert_line, 0, nchunk), nl);
		else
			/* For all lines in the chunk */
			for (i = 0; i < nchunk; i++)
				putpad(insert_line, nl);
		ttrow = HUGE;
		ttcol = HUGE;
	} else
		panic("ttdell: Can't insert/delete line");
}